

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * ImGui::FindWindowByName(char *name)

{
  ImU32 IVar1;
  value_type *ppIVar2;
  int i;
  int i_00;
  ImVector<ImGuiWindow_*> *this;
  
  this = &GImGui->Windows;
  IVar1 = ImHash(name,0,0);
  i_00 = 0;
  while( true ) {
    if (this->Size <= i_00) {
      return (ImGuiWindow *)0x0;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    if ((*ppIVar2)->ID == IVar1) break;
    i_00 = i_00 + 1;
  }
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
  return *ppIVar2;
}

Assistant:

ImGuiWindow* ImGui::FindWindowByName(const char* name)
{
    // FIXME-OPT: Store sorted hashes -> pointers so we can do a bissection in a contiguous block
    ImGuiContext& g = *GImGui;
    ImGuiID id = ImHash(name, 0);
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i]->ID == id)
            return g.Windows[i];
    return NULL;
}